

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cc
# Opt level: O2

bool flow::lang::TokenTraits::isLiteral(Token t)

{
  return t - Boolean < 9;
}

Assistant:

bool TokenTraits::isLiteral(Token t) {
  switch (t) {
    case Token::InterpolatedStringFragment:
    /*
     * skip Token::InterpolatedStringEnd,
     * because it's a tail of a composed literal that is
     * going to be explicitely matched when needed.
     */
    case Token::Boolean:
    case Token::Number:
    case Token::String:
    case Token::RawString:
    case Token::RegExp:
    case Token::IP:
    case Token::Cidr:
    case Token::NamedParam:
      return true;
    default:
      return false;
  }
}